

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# butterworth.cc
# Opt level: O1

void __thiscall Butterworth::MkLowPass(Butterworth *this,float freq)

{
  undefined1 auVar1 [16];
  float fVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  
  dVar3 = tan(((double)freq * 3.141592653589793) / 44100.0);
  fVar2 = (float)(1.0 / dVar3);
  auVar4._0_8_ = (double)fVar2;
  auVar4._8_8_ = 0;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar4,ZEXT816(0x3ff0000000000000));
  dVar3 = (double)(fVar2 * fVar2);
  dVar5 = 1.0 / (auVar1._0_8_ + dVar3);
  this->a_[0] = dVar5;
  this->a_[1] = dVar5 + dVar5;
  this->a_[2] = dVar5;
  this->b_[0] = (1.0 - dVar3) * (dVar5 + dVar5);
  auVar1 = vfmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar4,ZEXT816(0xc000000000000000));
  this->b_[1] = (auVar1._0_8_ + dVar3) * dVar5;
  return;
}

Assistant:

void Butterworth::MkLowPass(float freq)
{
    float lambda = 1. / tan(M_TAUOVR2 * freq / 44100.);
    a_[0] = 1. / (1. + 2. * lambda + lambda * lambda);
    a_[1] = 2. * a_[0];
    a_[2] = a_[0];

    b_[0] = 2. * a_[0] * (1. - lambda * lambda);
    b_[1] = a_[0] * (1. - 2. * lambda + lambda * lambda);
}